

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O3

bool __thiscall MultForm::findResLo(MultForm *this)

{
  _List_node_base *p_Var1;
  Varnode *pVVar2;
  Varnode *pVVar3;
  Varnode *pVVar4;
  Varnode *pVVar5;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *plVar6;
  _List_node_base *p_Var7;
  
  p_Var7 = (this->midtmp->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  plVar6 = &this->midtmp->descend;
  if (p_Var7 == (_List_node_base *)plVar6) {
    pVVar5 = this->lo1;
  }
  else {
    pVVar5 = this->lo1;
    do {
      p_Var1 = p_Var7[1]._M_next;
      p_Var7 = p_Var7->_M_next;
      if (((*(int *)((long)p_Var1->_M_next + 0x10) == 0x3f) &&
          (*(long *)(*(long *)((long)p_Var1[5]._M_next + 8) + 0x18) == 0)) &&
         (pVVar2 = *(Varnode **)((long)(p_Var1 + 4) + 8), this->reslo = pVVar2,
         pVVar2->size == pVVar5->size)) {
        return true;
      }
    } while (p_Var7 != (_List_node_base *)plVar6);
  }
  p_Var7 = (pVVar5->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node
           .super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)&pVVar5->descend) {
    pVVar2 = this->lo2;
    do {
      p_Var1 = p_Var7[1]._M_next;
      p_Var7 = p_Var7->_M_next;
      if (*(int *)((long)p_Var1->_M_next + 0x10) == 0x20) {
        pVVar3 = *(Varnode **)p_Var1[5]._M_next;
        pVVar4 = *(Varnode **)((long)p_Var1[5]._M_next + 8);
        if ((pVVar2->flags & 2) == 0) {
          if ((pVVar3 == pVVar2) || (pVVar4 == pVVar2)) {
LAB_002de98a:
            this->reslo = *(Varnode **)((long)(p_Var1 + 4) + 8);
            return true;
          }
        }
        else if ((((pVVar3->flags & 2) != 0) && ((pVVar3->loc).offset == (pVVar2->loc).offset)) ||
                (((pVVar4->flags & 2) != 0 && ((pVVar4->loc).offset == (pVVar2->loc).offset))))
        goto LAB_002de98a;
      }
    } while (p_Var7 != (_List_node_base *)&pVVar5->descend);
  }
  return false;
}

Assistant:

bool MultForm::findResLo(void)

{ // Assuming we found -midtmp-, find potential reslo
  list<PcodeOp *>::const_iterator iter,enditer;
  iter = midtmp->beginDescend();
  enditer = midtmp->endDescend();
  while(iter != enditer) {
    PcodeOp *op = *iter;
    ++iter;
    if (op->code() != CPUI_SUBPIECE) continue;
    if (op->getIn(1)->getOffset() != 0) continue; // Must grab low bytes
    reslo = op->getOut();
    if (reslo->getSize() != lo1->getSize()) continue;
    return true;
  }
  // If we reach here, it may be that separate multiplies of lo1*lo2 were used for reshi and reslo
  iter = lo1->beginDescend();
  enditer = lo1->endDescend();
  while(iter != enditer) {
    PcodeOp *op = *iter;
    ++iter;
    if (op->code() != CPUI_INT_MULT) continue;
    Varnode *vn1 = op->getIn(0);
    Varnode *vn2 = op->getIn(1);
    if (lo2->isConstant()) {
      if ((!vn1->isConstant() || (vn1->getOffset() != lo2->getOffset())) &&
	  (!vn2->isConstant() || (vn2->getOffset() != lo2->getOffset())))
	continue;
    }
    else 
      if ((op->getIn(0)!=lo2)&&(op->getIn(1)!=lo2)) continue;
    reslo = op->getOut();
    return true;
  }
  return false;
}